

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::
print_typed_attr<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
          *attr,string *name,uint32_t indent)

{
  tinyusdz tVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  long lVar5;
  uint32_t uVar6;
  string *psVar7;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_> pv;
  stringstream ss;
  tinyusdz local_200;
  undefined7 uStack_1ff;
  undefined1 local_1f8 [24];
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  psVar7 = name;
  local_1e0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if ((((this[0x228] == (tinyusdz)0x0) && (*(long *)(this + 0x218) == *(long *)(this + 0x210))) &&
      (this[0x208] == (tinyusdz)0x0)) && (this[0x248] != (tinyusdz)0x1)) goto LAB_002dd93a;
  bVar2 = AttrMetas::authored((AttrMetas *)this);
  if (((bVar2) || (this[0x248] != (tinyusdz)0x0)) || (this[0x228] != (tinyusdz)0x0)) {
LAB_002dd5b2:
    pprint::Indent_abi_cxx11_((string *)&local_200,(pprint *)((ulong)name & 0xffffffff),n);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)CONCAT71(uStack_1ff,local_200),local_1f8._0_8_);
    if ((undefined1 *)CONCAT71(uStack_1ff,local_200) != local_1f8 + 8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1ff,local_200),local_1f8._8_8_ + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"uniform ",8);
    value::
    TypeTraits<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>::
    type_name_abi_cxx11_();
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)CONCAT71(uStack_1ff,local_200),local_1f8._0_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(char *)(attr->_metas).interpolation,(long)(attr->_metas).elementSize);
    if ((undefined1 *)CONCAT71(uStack_1ff,local_200) != local_1f8 + 8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1ff,local_200),local_1f8._8_8_ + 1);
    }
    if (this[0x248] == (tinyusdz)0x1) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = None",7);
    }
    else {
      psVar7 = *(string **)(this + 0x218);
      tVar1 = this[0x228];
      if (psVar7 == *(string **)(this + 0x210)) {
        if (((byte)tVar1 & 1) != 0) goto LAB_002dd6b0;
        if (this[0x208] == (tinyusdz)0x0) goto LAB_002dd6c7;
      }
      else {
        if (((byte)tVar1 & 1) != 0) {
LAB_002dd6b0:
          local_200 = tVar1;
          ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
          vector((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                 local_1f8,
                 (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                 (this + 0x230));
          tVar1 = local_200;
        }
LAB_002dd6c7:
        local_200 = tVar1;
        if (((byte)local_200 & 1) != 0) {
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
          if (local_200 == (tinyusdz)0x0) {
            __assert_fail("has_value()",
                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                          ,0x591,
                          "value_type &nonstd::optional_lite::optional<std::vector<tinyusdz::value::matrix4d>>::value() [T = std::vector<tinyusdz::value::matrix4d>]"
                         );
          }
          ::std::operator<<(local_1a8,
                            (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                             *)local_1f8);
        }
        if ((((byte)local_200 & 1) != 0) && ((pointer)local_1f8._0_8_ != (pointer)0x0)) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ - local_1f8._0_8_);
        }
      }
    }
    uVar6 = (uint32_t)psVar7;
    bVar2 = AttrMetas::authored((AttrMetas *)this);
    if (bVar2) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (\n",3);
      print_attr_metas_abi_cxx11_
                ((string *)&local_200,this,(AttrMeta *)(ulong)((int)name + 1),uVar6);
      poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)CONCAT71(uStack_1ff,local_200),local_1f8._0_8_);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)name & 0xffffffff),n_00);
      poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)CONCAT71(uStack_1ff,local_200) != local_1f8 + 8) {
        operator_delete((undefined1 *)CONCAT71(uStack_1ff,local_200),local_1f8._8_8_ + 1);
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    psVar4 = *(string **)(this + 0x210);
    psVar7 = *(string **)(this + 0x218);
    uVar6 = extraout_EDX;
  }
  else {
    psVar4 = *(string **)(this + 0x210);
    psVar7 = *(string **)(this + 0x218);
    uVar6 = n;
    if (psVar7 == psVar4) goto LAB_002dd5b2;
  }
  if (psVar7 != psVar4) {
    pprint::Indent_abi_cxx11_((string *)&local_200,(pprint *)((ulong)name & 0xffffffff),uVar6);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)CONCAT71(uStack_1ff,local_200),local_1f8._0_8_);
    if ((undefined1 *)CONCAT71(uStack_1ff,local_200) != local_1f8 + 8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1ff,local_200),local_1f8._8_8_ + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"uniform ",8);
    value::
    TypeTraits<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>::
    type_name_abi_cxx11_();
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)CONCAT71(uStack_1ff,local_200),local_1f8._0_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(char *)(attr->_metas).interpolation,(long)(attr->_metas).elementSize);
    if ((undefined1 *)CONCAT71(uStack_1ff,local_200) != local_1f8 + 8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1ff,local_200),local_1f8._8_8_ + 1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
    lVar5 = (*(long *)(this + 0x218) - (long)*(Path **)(this + 0x210) >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (lVar5 == 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
    }
    else if (lVar5 == 1) {
      ::std::operator<<(local_1a8,*(Path **)(this + 0x210));
    }
    else {
      ::std::operator<<(local_1a8,
                        (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(this + 0x210));
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
LAB_002dd93a:
  psVar7 = local_1e0;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar7;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<T> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    if (attr.metas().authored() || attr.is_blocked() || attr.has_value() || attr.is_value_empty() || (!attr.is_connection())) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (attr.is_value_empty()) {
        // nothing to do
      } else {
        auto pv = attr.get_value();
        if (pv) {
          ss << " = " << pv.value();
        }
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".connect = ";

      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }
  }

  return ss.str();
}